

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,false>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  sel_t sVar12;
  ulong uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  ulong uVar16;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar8 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar8;
    }
    if (count + 0x3f < 0x40) {
      iVar8 = 0;
    }
    else {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = 0;
      uVar13 = 0;
      uVar15 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar14 = 0xffffffffffffffff;
        }
        else {
          uVar14 = puVar1[uVar13];
        }
        uVar16 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar16 = count;
        }
        uVar9 = uVar16;
        if (uVar14 != 0) {
          uVar9 = uVar15;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar15 < uVar16) {
              psVar2 = sel->sel_vector;
              psVar3 = true_sel->sel_vector;
              uVar15 = uVar15 << 4 | 8;
              do {
                uVar10 = uVar9;
                if (psVar2 != (sel_t *)0x0) {
                  uVar10 = (ulong)psVar2[uVar9];
                }
                lVar4 = *(long *)((long)ldata + (uVar15 - 8));
                lVar5 = *(long *)((long)&ldata->lower + uVar15);
                lVar6 = *(long *)((long)rdata + (uVar15 - 8));
                lVar7 = *(long *)((long)&rdata->lower + uVar15);
                psVar3[iVar8] = (sel_t)uVar10;
                iVar8 = iVar8 + (lVar5 == lVar7 && lVar4 == lVar6);
                uVar9 = uVar9 + 1;
                uVar15 = uVar15 + 0x10;
              } while (uVar16 != uVar9);
            }
          }
          else if (uVar15 < uVar16) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            uVar10 = uVar15 << 4 | 8;
            uVar9 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar12 = (int)uVar15 + (int)uVar9;
              }
              else {
                sVar12 = psVar2[uVar15 + uVar9];
              }
              if ((uVar14 >> (uVar9 & 0x3f) & 1) == 0) {
                uVar11 = 0;
              }
              else {
                uVar11 = (ulong)(*(long *)((long)&ldata->lower + uVar10) ==
                                 *(long *)((long)&rdata->lower + uVar10) &&
                                *(long *)((long)ldata + (uVar10 - 8)) ==
                                *(long *)((long)rdata + (uVar10 - 8)));
              }
              psVar3[iVar8] = sVar12;
              iVar8 = iVar8 + uVar11;
              uVar9 = uVar9 + 1;
              uVar10 = uVar10 + 0x10;
            } while ((uVar15 - uVar16) + uVar9 != 0);
            uVar9 = uVar15 + uVar9;
          }
        }
        uVar13 = uVar13 + 1;
        uVar15 = uVar9;
      } while (uVar13 != count + 0x3f >> 6);
    }
  }
  else {
    iVar8 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}